

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDSharedSimd128.cpp
# Opt level: O2

Instr * __thiscall LowererMD::Simd128LowerStoreElem(LowererMD *this,Instr *instr)

{
  uint8 dataWidth;
  OpCode OVar1;
  Opnd *this_00;
  RegOpnd *indexOpnd;
  Opnd *src1;
  code *pcVar2;
  bool bVar3;
  BYTE scaleFactor;
  JITTimeFunctionBody *this_01;
  undefined4 *puVar4;
  IndirOpnd *pIVar5;
  Instr *pIVar6;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [4];
  ValueType arrType;
  
  this_01 = Func::GetJITFunctionBody(this->m_func);
  bVar3 = JITTimeFunctionBody::IsAsmJsMode(this_01);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0xaf8,"(!m_func->GetJITFunctionBody()->IsAsmJsMode())",
                       "!m_func->GetJITFunctionBody()->IsAsmJsMode()");
    if (!bVar3) goto LAB_005ed192;
    *puVar4 = 0;
  }
  OVar1 = instr->m_opcode;
  if ((((0x3f < OVar1 - 0x306) ||
       ((0x8000000000014001U >> ((ulong)(OVar1 - 0x306) & 0x3f) & 1) == 0)) &&
      (OVar1 != Simd128_StArr_U4)) && ((OVar1 != Simd128_StArr_U8 && (OVar1 != Simd128_StArr_U16))))
  {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0xb01,
                       "(instr->m_opcode == Js::OpCode::Simd128_StArr_I4 || instr->m_opcode == Js::OpCode::Simd128_StArr_I8 || instr->m_opcode == Js::OpCode::Simd128_StArr_I16 || instr->m_opcode == Js::OpCode::Simd128_StArr_U4 || instr->m_opcode == Js::OpCode::Simd128_StArr_U8 || instr->m_opcode == Js::OpCode::Simd128_StArr_U16 || instr->m_opcode == Js::OpCode::Simd128_StArr_F4)"
                       ,
                       "instr->m_opcode == Js::OpCode::Simd128_StArr_I4 || instr->m_opcode == Js::OpCode::Simd128_StArr_I8 || instr->m_opcode == Js::OpCode::Simd128_StArr_I16 || instr->m_opcode == Js::OpCode::Simd128_StArr_U4 || instr->m_opcode == Js::OpCode::Simd128_StArr_U8 || instr->m_opcode == Js::OpCode::Simd128_StArr_U16 || instr->m_opcode == Js::OpCode::Simd128_StArr_F4"
                      );
    if (!bVar3) goto LAB_005ed192;
    *puVar4 = 0;
  }
  this_00 = instr->m_dst;
  pIVar5 = IR::Opnd::AsIndirOpnd(this_00);
  indexOpnd = pIVar5->m_indexOpnd;
  src1 = instr->m_src1;
  dataWidth = instr->dataWidth;
  pIVar5 = IR::Opnd::AsIndirOpnd(this_00);
  local_32[0] = (anon_union_2_4_ea848c7b_for_ValueType_13)
                *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                 &(pIVar5->m_baseOpnd->super_Opnd).m_valueType.field_0.field_0;
  bVar3 = ValueType::IsObject((ValueType *)&local_32[0].field_0);
  if (bVar3) {
    bVar3 = ValueType::IsTypedArray((ValueType *)&local_32[0].field_0);
    if (bVar3) goto LAB_005ed0b5;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar4 = 1;
  bVar3 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                     ,0xb0a,"(arrType.IsObject() && arrType.IsTypedArray())",
                     "arrType.IsObject() && arrType.IsTypedArray()");
  if (!bVar3) {
LAB_005ed192:
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  *puVar4 = 0;
LAB_005ed0b5:
  pIVar5 = IR::Opnd::AsIndirOpnd(this_00);
  Simd128GenerateUpperBoundCheck(this,indexOpnd,pIVar5,(ValueType)local_32[0].field_0,instr);
  pIVar5 = IR::Opnd::AsIndirOpnd(this_00);
  Simd128LoadHeadSegment(this,pIVar5,(ValueType)local_32[0].field_0,instr);
  scaleFactor = Lowerer::GetArrayIndirScale((ValueType)local_32[0].field_0);
  pIVar6 = Simd128ConvertToStore(this,this_00,src1,dataWidth,instr,scaleFactor);
  return pIVar6;
}

Assistant:

IR::Instr*
LowererMD::Simd128LowerStoreElem(IR::Instr *instr)
{
    Assert(!m_func->GetJITFunctionBody()->IsAsmJsMode());
    Assert(
           instr->m_opcode == Js::OpCode::Simd128_StArr_I4 ||
           instr->m_opcode == Js::OpCode::Simd128_StArr_I8 ||
           instr->m_opcode == Js::OpCode::Simd128_StArr_I16 ||
           instr->m_opcode == Js::OpCode::Simd128_StArr_U4 ||
           instr->m_opcode == Js::OpCode::Simd128_StArr_U8 ||
           instr->m_opcode == Js::OpCode::Simd128_StArr_U16 ||
           instr->m_opcode == Js::OpCode::Simd128_StArr_F4
        );

    IR::Opnd * dst = instr->GetDst();
    IR::RegOpnd * indexOpnd = dst->AsIndirOpnd()->GetIndexOpnd();
    IR::Opnd * src1 = instr->GetSrc1();
    uint8 dataWidth = instr->dataWidth;
    ValueType arrType = dst->AsIndirOpnd()->GetBaseOpnd()->GetValueType();

    // If we type-specialized, then array is a definite type-array.
    Assert(arrType.IsObject() && arrType.IsTypedArray());

    Simd128GenerateUpperBoundCheck(indexOpnd, dst->AsIndirOpnd(), arrType, instr);
    Simd128LoadHeadSegment(dst->AsIndirOpnd(), arrType, instr);
    return Simd128ConvertToStore(dst, src1, dataWidth, instr, m_lowerer->GetArrayIndirScale(arrType) /*scale factor*/);
}